

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O1

FIOBJ http_req2str(http_s *h)

{
  ulong uVar1;
  char cVar2;
  size_t sVar3;
  FIOBJ obj;
  fiobj_object_vtable_s *pfVar4;
  uint uVar5;
  uint *in_RCX;
  uint *puVar6;
  uint uVar7;
  _func_int_FIOBJ_void_ptr *task;
  FIOBJ FVar8;
  char *data;
  header_writer_s w;
  fio_str_info_s t;
  FIOBJ local_50 [3];
  fio_str_info_s local_38;
  
  if (((h == (http_s *)0x0) || (((h->method == 0 && (h->status_str == 0)) && (h->status != 0)))) ||
     (sVar3 = fiobj_hash_count(h->headers), sVar3 == 0)) {
    return 0;
  }
  local_50[0] = fiobj_str_buf(0);
  if (h->status_str == 0) {
    fiobj_str_concat(local_50[0],h->method);
    fiobj_str_write(local_50[0]," ",1);
    fiobj_str_concat(local_50[0],h->path);
    if (h->query != 0) {
      fiobj_str_write(local_50[0],"?",1);
      fiobj_str_concat(local_50[0],h->query);
    }
    uVar1 = h->version;
    puVar6 = in_RCX;
    if (uVar1 == 0) {
LAB_0014cfd0:
      local_38.data = anon_var_dwarf_20f;
      local_38.len._0_4_ = 4;
      in_RCX = puVar6;
      goto LAB_0014cfe3;
    }
    if ((uVar1 & 1) == 0) {
      uVar5 = (uint)uVar1 & 6;
      puVar6 = (uint *)(ulong)uVar5;
      cVar2 = '(';
      switch(uVar5) {
      case 0:
switchD_0014cf88_caseD_0:
        cVar2 = *(char *)(uVar1 & 0xfffffffffffffff8);
        break;
      case 4:
switchD_0014cf88_caseD_4:
        cVar2 = '*';
        break;
      case 6:
        in_RCX = puVar6;
        if ((char)uVar1 == '&') {
          local_38.data = anon_var_dwarf_21a;
          local_38.len._0_4_ = 5;
        }
        else {
          uVar7 = (uint)uVar1 & 0xff;
          if (uVar7 != 0x16) {
            if (uVar7 == 6) goto LAB_0014cfd0;
            puVar6 = (uint *)((long)&switchD_0014d025::switchdataD_00168f80 +
                             (long)(int)(&switchD_0014d025::switchdataD_00168f80)[(long)puVar6]);
            switch(uVar5) {
            case 0:
              goto switchD_0014cf88_caseD_0;
            case 4:
              goto switchD_0014cf88_caseD_4;
            case 6:
              cVar2 = (char)uVar1;
            }
            break;
          }
          local_38.data = anon_var_dwarf_225;
          local_38.len._0_4_ = 4;
        }
LAB_0014cfe3:
        local_38.capa._0_4_ = 0;
        local_38.capa._4_4_ = 0;
        local_38.len._4_4_ = 0;
        goto LAB_0014d080;
      }
      in_RCX = &switchD_0014d042::switchdataD_00168f9c;
      switch(cVar2) {
      case '\'':
        pfVar4 = &FIOBJECT_VTABLE_FLOAT;
        break;
      case '(':
        pfVar4 = &FIOBJECT_VTABLE_STRING;
        break;
      case ')':
        pfVar4 = &FIOBJECT_VTABLE_ARRAY;
        break;
      case '*':
        pfVar4 = &FIOBJECT_VTABLE_HASH;
        break;
      case '+':
        pfVar4 = &FIOBJECT_VTABLE_DATA;
        break;
      default:
        pfVar4 = &FIOBJECT_VTABLE_NUMBER;
        in_RCX = puVar6;
      }
      (*pfVar4->to_str)(&local_38,uVar1);
    }
    else {
      fio_ltocstr(&local_38,(long)uVar1 >> 1);
    }
LAB_0014d080:
    if ((CONCAT44(local_38.len._4_4_,(undefined4)local_38.len) < 6) || (local_38.data[5] != '1')) {
      data = " HTTP/1.1\r\n";
      sVar3 = 10;
      goto LAB_0014d0c8;
    }
    fiobj_str_write(local_50[0]," ",1);
    FVar8 = h->version;
  }
  else {
    fiobj_str_concat(local_50[0],h->version);
    fiobj_str_write(local_50[0]," ",1);
    FVar8 = local_50[0];
    obj = fiobj_num_tmp(h->status);
    fiobj_str_concat(FVar8,obj);
    fiobj_str_write(local_50[0]," ",1);
    FVar8 = h->status_str;
  }
  fiobj_str_concat(local_50[0],FVar8);
  data = "\r\n";
  sVar3 = 2;
LAB_0014d0c8:
  fiobj_str_write(local_50[0],data,sVar3);
  fiobj_each1(h->headers,(size_t)local_50,task,in_RCX);
  fiobj_str_write(local_50[0],"\r\n",2);
  if (h->body != 0) {
    fiobj_str_concat(local_50[0],h->body);
  }
  return local_50[0];
}

Assistant:

FIOBJ http_req2str(http_s *h) {
  if (HTTP_INVALID_HANDLE(h) || !fiobj_hash_count(h->headers))
    return FIOBJ_INVALID;

  struct header_writer_s w;
  w.dest = fiobj_str_buf(0);
  if (h->status_str) {
    fiobj_str_join(w.dest, h->version);
    fiobj_str_write(w.dest, " ", 1);
    fiobj_str_join(w.dest, fiobj_num_tmp(h->status));
    fiobj_str_write(w.dest, " ", 1);
    fiobj_str_join(w.dest, h->status_str);
    fiobj_str_write(w.dest, "\r\n", 2);
  } else {
    fiobj_str_join(w.dest, h->method);
    fiobj_str_write(w.dest, " ", 1);
    fiobj_str_join(w.dest, h->path);
    if (h->query) {
      fiobj_str_write(w.dest, "?", 1);
      fiobj_str_join(w.dest, h->query);
    }
    {
      fio_str_info_s t = fiobj_obj2cstr(h->version);
      if (t.len < 6 || t.data[5] != '1')
        fiobj_str_write(w.dest, " HTTP/1.1\r\n", 10);
      else {
        fiobj_str_write(w.dest, " ", 1);
        fiobj_str_join(w.dest, h->version);
        fiobj_str_write(w.dest, "\r\n", 2);
      }
    }
  }

  fiobj_each1(h->headers, 0, write_header, &w);
  fiobj_str_write(w.dest, "\r\n", 2);
  if (h->body) {
    // fiobj_data_seek(h->body, 0);
    // fio_str_info_s t = fiobj_data_read(h->body, 0);
    // fiobj_str_write(w.dest, t.data, t.len);
    fiobj_str_join(w.dest, h->body);
  }
  return w.dest;
}